

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring64Map::rank(Roaring64Map *this,uint64_t x)

{
  bool bVar1;
  iterator result;
  reference puVar2;
  ulong in_RSI;
  char *in_RDI;
  Roaring64Map *unaff_retaddr;
  iterator it_end;
  iterator it;
  uint64_t count;
  uint64_t ans;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint7 in_stack_ffffffffffffffc0;
  bool bVar3;
  _Self local_28;
  long local_20;
  uint64_t local_18;
  ulong local_10;
  
  local_10 = in_RSI;
  local_18 = roaring::Roaring64Map::rank(unaff_retaddr,(uint64_t)in_RDI);
  local_20 = 0;
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  result = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  while( true ) {
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    bVar3 = false;
    if (bVar1) {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                         ((_Rb_tree_const_iterator<unsigned_long> *)0x1056fe);
      bVar3 = *puVar2 <= local_10;
    }
    if (bVar3 == false) break;
    local_20 = local_20 + 1;
    std::_Rb_tree_const_iterator<unsigned_long>::operator++
              ((_Rb_tree_const_iterator<unsigned_long> *)CONCAT17(bVar3,in_stack_ffffffffffffffc0));
  }
  _assert_true((unsigned_long)result._M_node,in_RDI,(char *)(ulong)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
  return local_18;
}

Assistant:

uint64_t rank(uint64_t x) const {
        uint64_t ans = plain.rank(x);

        uint64_t count = 0;
        auto it = check.begin();
        auto it_end = check.end();
        for (; it != it_end && *it <= x; ++it) ++count;
        assert_true(ans == count);

        return ans;
    }